

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v11::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  int *piVar1;
  size_t sVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  
  compare(this,other);
  sVar2 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar2 != 0) {
    puVar3 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar5 = (long)(other->exp_ - this->exp_);
    puVar4 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar6 = lVar5 << 0x20;
    sVar7 = 0;
    lVar8 = 0;
    do {
      lVar6 = lVar6 + 0x100000000;
      lVar9 = (ulong)puVar4[lVar5 + sVar7] + (lVar8 - (ulong)puVar3[sVar7]);
      puVar4[lVar5 + sVar7] = (uint)lVar9;
      lVar8 = lVar9 >> 0x3f;
      sVar7 = sVar7 + 1;
    } while (sVar2 != sVar7);
    if (lVar9 < 0) {
      piVar1 = (int *)((long)(this->bigits_).super_buffer<unsigned_int>.ptr_ + (lVar6 >> 0x1e));
      *piVar1 = *piVar1 + -1;
    }
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    if (borrow != 0) subtract_bigits(i, 0, borrow);
    FMT_ASSERT(borrow == 0, "");
    remove_leading_zeros();
  }